

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O1

void __thiscall tf::TFProfManager::~TFProfManager(TFProfManager *this)

{
  pointer pcVar1;
  long lVar2;
  pointer psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ulong uVar5;
  Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> serializer;
  ProfileData data;
  ofstream ofs;
  undefined1 local_3c8 [32];
  __native_type local_3a8 [9];
  long local_228;
  filebuf local_220 [24];
  byte abStack_208 [216];
  ios_base local_130 [264];
  
  std::ofstream::ofstream((ofstream *)&local_228,(string *)this,_S_out);
  if ((abStack_208[*(long *)(local_228 + -0x18)] & 5) == 0) {
    lVar2 = std::__cxx11::string::rfind((char *)this,0x113236,0xffffffffffffffff);
    if (lVar2 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"[\n",2);
      if ((this->_observers).
          super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_observers).
          super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar2 = 0;
        uVar5 = 0;
        do {
          if (uVar5 != 0) {
            local_3a8[0]._0_1_ = 0x2c;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_228,local_3c8 + 0x20,1);
          }
          TFProfObserver::dump
                    (*(TFProfObserver **)
                      ((long)&(((this->_observers).
                                super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + lVar2),(ostream *)&local_228);
          uVar5 = uVar5 + 1;
          lVar2 = lVar2 + 0x10;
        } while (uVar5 < (ulong)((long)(this->_observers).
                                       super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->_observers).
                                       super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"]\n",2);
    }
    else {
      local_3a8[0].__align = 0;
      local_3a8[0]._8_8_ = 0;
      local_3a8[0]._16_8_ = 0;
      std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>::reserve
                ((vector<tf::Timeline,_std::allocator<tf::Timeline>_> *)(local_3c8 + 0x20),
                 (long)(this->_observers).
                       super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_observers).
                       super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      psVar3 = (this->_observers).
               super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->_observers).
          super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
        lVar2 = 0;
        uVar5 = 0;
        do {
          std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>::emplace_back<tf::Timeline>
                    ((vector<tf::Timeline,_std::allocator<tf::Timeline>_> *)(local_3c8 + 0x20),
                     (Timeline *)
                     (*(long *)((long)&(psVar3->
                                       super___shared_ptr<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + lVar2) + 8));
          uVar5 = uVar5 + 1;
          psVar3 = (this->_observers).
                   super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar2 = lVar2 + 0x10;
        } while (uVar5 < (ulong)((long)(this->_observers).
                                       super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >>
                                4));
      }
      local_3c8._0_8_ = (ofstream *)&local_228;
      Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::
      _save<const_std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>_&,_nullptr>
                ((Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> *)local_3c8,
                 (vector<tf::Timeline,_std::allocator<tf::Timeline>_> *)(local_3c8 + 0x20));
      std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>::~vector
                ((vector<tf::Timeline,_std::allocator<tf::Timeline>_> *)(local_3c8 + 0x20));
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_3c8 + 0x20));
    psVar3 = (this->_observers).
             super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->_observers).
        super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
      lVar2 = 0;
      uVar5 = 0;
      do {
        TFProfObserver::summary
                  (*(TFProfObserver **)
                    ((long)&(psVar3->
                            super___shared_ptr<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + lVar2),(ostream *)(local_3c8 + 0x20));
        uVar5 = uVar5 + 1;
        psVar3 = (this->_observers).
                 super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar2 = lVar2 + 0x10;
      } while (uVar5 < (ulong)((long)(this->_observers).
                                     super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4)
              );
    }
    std::__cxx11::stringbuf::str();
    ~TFProfManager((TFProfManager *)local_3c8);
  }
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  std::
  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  ::~vector(&this->_observers);
  pcVar1 = (this->_fpath)._M_dataplus._M_p;
  paVar4 = &(this->_fpath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline TFProfManager::~TFProfManager() {
  std::ofstream ofs(_fpath);
  if(ofs) {
    // .tfp
    if(_fpath.rfind(".tfp") != std::string::npos) {
      ProfileData data;
      data.timelines.reserve(_observers.size());
      for(size_t i=0; i<_observers.size(); ++i) {
        data.timelines.push_back(std::move(_observers[i]->_timeline));
      }
      Serializer<std::ofstream> serializer(ofs); 
      serializer(data);
    }
    // .json
    else { // if(_fpath.rfind(".json") != std::string::npos) {
      ofs << "[\n";
      for(size_t i=0; i<_observers.size(); ++i) {
        if(i) ofs << ',';
        _observers[i]->dump(ofs);
      }
      ofs << "]\n";
    }
  }
  // do a summary report in stderr for each observer
  else {
    std::ostringstream oss;
    for(size_t i=0; i<_observers.size(); ++i) {
      _observers[i]->summary(oss);
    }
    fprintf(stderr, "%s", oss.str().c_str());
  }
}